

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O1

BOOL __thiscall Js::GlobalObject::HasOwnItem(GlobalObject *this,uint32 index)

{
  RecyclableObject *pRVar1;
  PropertyQueryFlags PVar2;
  uint uVar3;
  int iVar4;
  
  PVar2 = DynamicObject::HasItemQuery((DynamicObject *)this,index);
  uVar3 = 1;
  if (PVar2 != Property_Found) {
    pRVar1 = (this->directHostObject).ptr;
    if (pRVar1 == (RecyclableObject *)0x0) {
      uVar3 = 0;
    }
    else {
      iVar4 = (*(pRVar1->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x24])(pRVar1,index);
      uVar3 = (uint)(iVar4 == 1);
    }
  }
  return uVar3;
}

Assistant:

BOOL GlobalObject::HasOwnItem(uint32 index)
    {
        return JavascriptConversion::PropertyQueryFlagsToBoolean(DynamicObject::HasItemQuery(index))
            || (this->directHostObject && this->directHostObject->HasItem(index));
    }